

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_xlat.cpp
# Opt level: O2

void P_LoadTranslator(char *lumpname)

{
  int iVar1;
  long *yyp;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  FParseToken in_stack_fffffffffffffef8;
  XlatParseContext context;
  undefined4 local_60 [20];
  
  bVar5 = 0;
  iVar1 = FString::CompareNoCase(&LastTranslator,lumpname);
  if (iVar1 != 0) {
    P_ClearTranslator();
    yyp = (long *)malloc(0x2278);
    if (yyp != (long *)0x0) {
      *(undefined4 *)(yyp + 1) = 0xffffffff;
      *yyp = (long)(yyp + 3);
      *(undefined2 *)(yyp + 3) = 0;
      *(undefined1 *)((long)yyp + 0x1a) = 0;
    }
    context.super_FParseContext.SourceFile = (char *)0x0;
    context.super_FParseContext.SourceLine = 0;
    context.super_FParseContext.symbols.Array = (FParseSymbol *)0x0;
    context.super_FParseContext.symbols.Most = 0;
    context.super_FParseContext.symbols.Count = 0;
    context.super_FParseContext.Parse = XlatParse;
    context.super_FParseContext.TokenTrans = TokenTrans;
    context.super_FParseContext._vptr_FParseContext = (_func_int **)&PTR__FParseContext_00704cc0;
    context.DefiningLineType = -1;
    context.super_FParseContext.pParser = yyp;
    FParseContext::ParseLump(&context.super_FParseContext,lumpname);
    local_60[0] = 0;
    puVar3 = (undefined8 *)local_60;
    puVar4 = (undefined8 *)&stack0xfffffffffffffef8;
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    XlatParse(yyp,0,in_stack_fffffffffffffef8,&context.super_FParseContext);
    XlatParseFree(yyp,free);
    FString::operator=(&LastTranslator,lumpname);
    FParseContext::~FParseContext(&context.super_FParseContext);
  }
  return;
}

Assistant:

void P_LoadTranslator(const char *lumpname)
{
	// Only read the lump if it differs from the previous one.
	if (LastTranslator.CompareNoCase(lumpname))
	{
		// Clear the old data before parsing the lump.
		P_ClearTranslator();

		void *pParser = XlatParseAlloc(malloc);

		XlatParseContext context(pParser, XlatParse, TokenTrans);

		context.ParseLump(lumpname);
		FParseToken tok;
		tok.val=0;
		XlatParse(pParser, 0, tok, &context);
		XlatParseFree(pParser, free);
		LastTranslator = lumpname;
	}
}